

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O0

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadSpotLight(XMLLoader *this,Ref<embree::XML> *xml)

{
  AffineSpace3fa *space_00;
  undefined8 *in_RDX;
  Node *in_RDI;
  float fVar1;
  Vec3fa VVar2;
  SpotLight light;
  float angleMax;
  float angleMin;
  Vec3fa D;
  Vec3fa P;
  Vec3fa I;
  AffineSpace3fa space;
  Ref<embree::XML> *in_stack_00000620;
  XMLLoader *in_stack_00000628;
  float in_stack_fffffffffffffc60;
  float in_stack_fffffffffffffc64;
  SpotLight *in_stack_fffffffffffffc68;
  LightNodeImpl<embree::SceneGraph::SpotLight> *in_stack_fffffffffffffc70;
  Vec3fa *in_stack_fffffffffffffc78;
  SpotLight *this_00;
  Ref<embree::XML> *in_stack_fffffffffffffcb0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *xml_00;
  undefined4 in_stack_fffffffffffffcb8;
  undefined4 in_stack_fffffffffffffcbc;
  Ref<embree::XML> *xml_01;
  XMLLoader *this_01;
  string *in_stack_fffffffffffffd18;
  XML *in_stack_fffffffffffffd20;
  SpotLight local_298;
  allocator local_239;
  string local_238 [32];
  long *local_218;
  float local_210;
  allocator local_209;
  string local_208 [32];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1e8;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined1 local_1a1 [33];
  long *local_180 [5];
  allocator local_151;
  string local_150 [32];
  long *local_130 [10];
  undefined8 *local_e0;
  undefined8 *local_c8;
  undefined8 *local_c0;
  undefined8 *local_b8;
  undefined4 local_a4;
  undefined4 local_a0;
  undefined4 local_9c;
  undefined8 *local_98;
  long **local_90;
  long **local_80;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_70;
  SpotLight *local_60;
  undefined8 *local_50;
  AffineSpace3fa *local_48;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined4 local_28;
  undefined4 local_24;
  undefined4 local_20;
  undefined4 local_1c;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_e0 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_150,"AffineSpace",&local_151);
  XML::child(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  load<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>>>
            (in_stack_00000628,in_stack_00000620);
  local_90 = local_130;
  if (local_130[0] != (long *)0x0) {
    (**(code **)(*local_130[0] + 0x18))();
  }
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  local_b8 = local_e0;
  xml_01 = (Ref<embree::XML> *)*local_e0;
  this_01 = (XMLLoader *)local_1a1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_1a1 + 1),"I",(allocator *)this_01);
  XML::child(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  VVar2 = load<embree::Vec3fa>(this_01,xml_01);
  local_80 = local_180;
  if (local_180[0] != (long *)0x0) {
    (**(code **)(*local_180[0] + 0x18))(VVar2.field_0._0_4_,VVar2.field_0._8_8_);
  }
  std::__cxx11::string::~string((string *)(local_1a1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_1a1);
  local_50 = &local_1b8;
  local_18 = 0;
  uStack_10 = 0;
  local_1b8 = 0;
  uStack_1b0 = 0;
  local_98 = &local_1d8;
  local_9c = 0;
  local_a0 = 0;
  local_a4 = 0x3f800000;
  local_1c = 0;
  local_20 = 0x3f800000;
  local_24 = 0;
  local_28 = 0;
  local_38 = 0;
  uStack_30 = 0x3f800000;
  local_1d8._0_4_ = 0.0;
  local_1d8._4_4_ = 0.0;
  uStack_1d0 = 0x3f800000;
  local_c0 = local_e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_208,"angleMin",&local_209);
  XML::child(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  fVar1 = load<float>((XMLLoader *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
                      in_stack_fffffffffffffcb0);
  xml_00 = &local_1e8;
  local_70 = xml_00;
  if ((long *)local_1e8._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_1e8._0_8_ + 0x18))();
  }
  std::__cxx11::string::~string(local_208);
  std::allocator<char>::~allocator((allocator<char> *)&local_209);
  local_c8 = local_e0;
  local_1e8.m128[3] = fVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_238,"angleMax",&local_239);
  XML::child(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  fVar1 = load<float>((XMLLoader *)CONCAT44(fVar1,in_stack_fffffffffffffcb8),
                      (Ref<embree::XML> *)&xml_00->field_1);
  this_00 = (SpotLight *)&local_218;
  local_60 = this_00;
  if (local_218 != (long *)0x0) {
    (**(code **)(*local_218 + 0x18))();
  }
  std::__cxx11::string::~string(local_238);
  std::allocator<char>::~allocator((allocator<char> *)&local_239);
  local_210 = fVar1;
  SceneGraph::SpotLight::SpotLight
            (&local_298,in_stack_fffffffffffffc78,(Vec3fa *)in_stack_fffffffffffffc70,
             (Vec3fa *)in_stack_fffffffffffffc68,in_stack_fffffffffffffc64,in_stack_fffffffffffffc60
            );
  space_00 = (AffineSpace3fa *)
             SceneGraph::LightNodeImpl<embree::SceneGraph::SpotLight>::operator_new(0x3838d2);
  SceneGraph::SpotLight::transform(this_00,space_00);
  SceneGraph::LightNodeImpl<embree::SceneGraph::SpotLight>::LightNodeImpl
            (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
  (in_RDI->super_RefCount)._vptr_RefCount = (_func_int **)space_00;
  if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
    local_48 = space_00;
    (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
  }
  return (Ref<embree::SceneGraph::Node>)in_RDI;
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadSpotLight(const Ref<XML>& xml) 
  {
    const AffineSpace3fa space = load<AffineSpace3fa>(xml->child("AffineSpace"));
    const Vec3fa I = load<Vec3fa>(xml->child("I"));
    const Vec3fa P = Vec3fa(zero);
    const Vec3fa D = Vec3fa(0,0,1);
    const float angleMin = load<float>(xml->child("angleMin"));
    const float angleMax = load<float>(xml->child("angleMax"));
    const SceneGraph::SpotLight light = SceneGraph::SpotLight(P,D,I,angleMin,angleMax);
    return new SceneGraph::LightNodeImpl<SceneGraph::SpotLight>(light.transform(space));
  }